

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.cpp
# Opt level: O0

bool __thiscall ROM::Request::Node::subtract(Node *this,Map *map)

{
  bool bVar1;
  pointer this_00;
  byte local_72;
  byte local_71;
  const_iterator local_60;
  Node *local_58;
  undefined1 local_49;
  iterator iStack_48;
  bool did_subtract;
  __normal_iterator<ROM::Request::Node_*,_std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>_>
  local_40;
  iterator iterator;
  bool has_any;
  const_iterator cStack_30;
  bool has_all;
  _Self local_28;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *local_20;
  Map *map_local;
  Node *this_local;
  
  local_20 = map;
  map_local = (Map *)this;
  if (this->type == One) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::find(map,&this->name);
    cStack_30 = std::
                map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                ::end(local_20);
    this_local._7_1_ = std::operator!=(&local_28,&stack0xffffffffffffffd0);
  }
  else {
    iterator._M_current._7_1_ = 1;
    iterator._M_current._6_1_ = 0;
    local_40._M_current =
         (Node *)std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::begin
                           (&this->children);
    while( true ) {
      iStack_48 = std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::end
                            (&this->children);
      bVar1 = __gnu_cxx::operator!=(&local_40,&stack0xffffffffffffffb8);
      if (!bVar1) break;
      this_00 = __gnu_cxx::
                __normal_iterator<ROM::Request::Node_*,_std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>_>
                ::operator->(&local_40);
      local_49 = subtract(this_00,local_20);
      iterator._M_current._7_1_ = (iterator._M_current._7_1_ & 1 & local_49) != 0;
      iterator._M_current._6_1_ = (iterator._M_current._6_1_ & 1) != 0 || (bool)local_49;
      if ((bool)local_49) {
        __gnu_cxx::
        __normal_iterator<ROM::Request::Node_const*,std::vector<ROM::Request::Node,std::allocator<ROM::Request::Node>>>
        ::__normal_iterator<ROM::Request::Node*>
                  ((__normal_iterator<ROM::Request::Node_const*,std::vector<ROM::Request::Node,std::allocator<ROM::Request::Node>>>
                    *)&local_60,&local_40);
        local_58 = (Node *)std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::
                           erase(&this->children,local_60);
        local_40._M_current = local_58;
      }
      else {
        __gnu_cxx::
        __normal_iterator<ROM::Request::Node_*,_std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>_>
        ::operator++(&local_40);
      }
    }
    if ((this->type != All) || (local_71 = 1, (iterator._M_current._7_1_ & 1) == 0)) {
      local_72 = 0;
      if (this->type == Any) {
        local_72 = iterator._M_current._6_1_;
      }
      local_71 = local_72;
    }
    this_local._7_1_ = (bool)(local_71 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool Request::Node::subtract(const ROM::Map &map) {
	switch(type) {
		case Type::One:
		return map.find(name) != map.end();

		default: {
			bool has_all = true;
			bool has_any = false;

			auto iterator = children.begin();
			while(iterator != children.end()) {
				const bool did_subtract = iterator->subtract(map);
				has_all &= did_subtract;
				has_any |= did_subtract;
				if(did_subtract) {
					iterator = children.erase(iterator);
				} else {
					++iterator;
				}
			}

			return (type == Type::All && has_all) || (type == Type::Any && has_any);
		}
	}
}